

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void pcache1TruncateUnsafe(PCache1 *pCache,uint iLimit)

{
  PgHdr1 *pPage;
  uint h;
  ulong uVar1;
  PgHdr1 **ppPVar2;
  
  for (uVar1 = 0; uVar1 < pCache->nHash; uVar1 = uVar1 + 1) {
    ppPVar2 = pCache->apHash + uVar1;
    while (pPage = *ppPVar2, pPage != (PgHdr1 *)0x0) {
      if (pPage->iKey < iLimit) {
        ppPVar2 = &pPage->pNext;
      }
      else {
        pCache->nPage = pCache->nPage - 1;
        *ppPVar2 = pPage->pNext;
        if (pPage->isPinned == '\0') {
          pcache1PinPage(pPage);
        }
        pcache1FreePage(pPage);
      }
    }
  }
  return;
}

Assistant:

static void pcache1TruncateUnsafe(
  PCache1 *pCache,             /* The cache to truncate */
  unsigned int iLimit          /* Drop pages with this pgno or larger */
){
  TESTONLY( unsigned int nPage = 0; )  /* To assert pCache->nPage is correct */
  unsigned int h;
  assert( sqlite3_mutex_held(pCache->pGroup->mutex) );
  for(h=0; h<pCache->nHash; h++){
    PgHdr1 **pp = &pCache->apHash[h]; 
    PgHdr1 *pPage;
    while( (pPage = *pp)!=0 ){
      if( pPage->iKey>=iLimit ){
        pCache->nPage--;
        *pp = pPage->pNext;
        if( !pPage->isPinned ) pcache1PinPage(pPage);
        pcache1FreePage(pPage);
      }else{
        pp = &pPage->pNext;
        TESTONLY( nPage++; )
      }
    }
  }
  assert( pCache->nPage==nPage );
}